

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffopentest(int soname,fitsfile **fptr,char *name,int mode,int *status)

{
  uint in_EDI;
  int *in_R8;
  int *in_stack_000034f0;
  int in_stack_000034fc;
  char *in_stack_00003500;
  fitsfile **in_stack_00003508;
  int local_4;
  
  if (in_EDI == 10) {
    ffopen(in_stack_00003508,in_stack_00003500,in_stack_000034fc,in_stack_000034f0);
    local_4 = *in_R8;
  }
  else {
    printf("\nERROR: Mismatch in the CFITSIO_SONAME value in the fitsio.h include file\n");
    printf("that was used to build the CFITSIO library, and the value in the include file\n");
    printf("that was used when compiling the application program:\n");
    printf("   Version used to build the CFITSIO library   = %d\n",10);
    printf("   Version included by the application program = %d\n",(ulong)in_EDI);
    printf("\nFix this by recompiling and then relinking this application program \n");
    printf("with the CFITSIO library.\n");
    *in_R8 = 0x68;
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffopentest(int soname,       /* I - CFITSIO shared library version     */
                                 /*     application program (fitsio.h file) */
           fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - full name of file to open           */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file with either readonly or read/write access.
  First test that the SONAME of fitsio.h used to build the CFITSIO library
  is the same as was used in compiling the application program that
  links to the library.
*/
{ 
    if (soname != CFITSIO_SONAME)
    {
        printf("\nERROR: Mismatch in the CFITSIO_SONAME value in the fitsio.h include file\n");
	printf("that was used to build the CFITSIO library, and the value in the include file\n");
	printf("that was used when compiling the application program:\n");
	printf("   Version used to build the CFITSIO library   = %d\n",CFITSIO_SONAME);
	printf("   Version included by the application program = %d\n",soname);
	printf("\nFix this by recompiling and then relinking this application program \n");
	printf("with the CFITSIO library.\n");

        *status = FILE_NOT_OPENED;
	return(*status);
    }

    /* now call the normal file open routine */
    ffopen(fptr, name, mode, status);
    return(*status);
}